

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::postscriptFunc(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *this_01;
  uint uVar1;
  factory_type this_02;
  int iVar2;
  RefAST RVar3;
  NoViableAltException *this_03;
  RefAST tmp124_AST;
  RefAST tmp121_AST;
  RefAST tmp120_AST;
  RefAST postscriptFunc_AST;
  RefAST tmp119_AST;
  ASTPair currentAST;
  ASTFactory local_d0;
  undefined1 local_c0 [16];
  ASTFactory local_b0;
  RefCount<AST> local_a0;
  ASTPair local_98;
  RefCount<Token> local_80;
  RefCount<AST> local_78;
  RefCount<Token> local_70;
  RefCount<Token> local_68;
  RefCount<Token> local_60;
  RefToken local_58;
  RefCount<Token> local_50;
  RefAST local_48;
  RefAST local_40;
  RefCount<Token> local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_b0.nodeFactory = (factory_type)nullAST;
  local_98.root.ref = (Ref *)0x0;
  local_98.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_b0.nodeFactory = (factory_type)0x0;
  }
  else {
    uVar1 = (nullAST.ref)->count;
    (nullAST.ref)->count = uVar1 + 1;
    ((Ref *)local_b0.nodeFactory)->count = uVar1 + 2;
  }
  local_a0.ref = (Ref *)local_b0.nodeFactory;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_60,this,1);
  this_01 = &(this->super_LLkParser).super_Parser.astFactory;
  ASTFactory::create((ASTFactory *)(local_c0 + 8),(RefToken *)this_01);
  RefCount<AST>::operator=(&local_a0,(RefCount<AST> *)(local_c0 + 8));
  RefCount<AST>::~RefCount((RefCount<AST> *)(local_c0 + 8));
  RefCount<Token>::~RefCount(&local_60);
  if (local_a0.ref == (Ref *)0x0) {
    local_40.ref = (Ref *)0x0;
  }
  else {
    (local_a0.ref)->count = (local_a0.ref)->count + 1;
    local_40.ref = local_a0.ref;
  }
  ASTFactory::makeASTRoot(this_01,&local_98,&local_40);
  RefCount<AST>::~RefCount(&local_40);
  Parser::match((Parser *)this,0x1e);
  local_c0._8_8_ = nullAST;
  if (nullAST.ref == (Ref *)0x0) {
    local_c0._8_8_ = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_68,this,1);
  ASTFactory::create((ASTFactory *)local_c0,(RefToken *)this_01);
  RefCount<AST>::operator=((RefCount<AST> *)(local_c0 + 8),(RefCount<AST> *)local_c0);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_c0);
  RefCount<Token>::~RefCount(&local_68);
  Parser::match((Parser *)this,6);
  local_c0._0_8_ = nullAST;
  if (nullAST.ref == (Ref *)0x0) {
    local_c0._0_8_ = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_70,this,1);
  ASTFactory::create(&local_d0,(RefToken *)this_01);
  RefCount<AST>::operator=((RefCount<AST> *)local_c0,(RefCount<AST> *)&local_d0);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_d0);
  RefCount<Token>::~RefCount(&local_70);
  if ((Ref *)local_c0._0_8_ == (Ref *)0x0) {
    local_48.ref = (Ref *)0x0;
  }
  else {
    *(uint *)(local_c0._0_8_ + 8) = *(uint *)(local_c0._0_8_ + 8) + 1;
    local_48.ref = (Ref *)local_c0._0_8_;
  }
  ASTFactory::addASTChild(this_01,&local_98,&local_48);
  local_d0.nodeFactory = (factory_type)this_00;
  RefCount<AST>::~RefCount(&local_48);
  Parser::match((Parser *)this,0x14);
  do {
    iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar2 != 0x14) {
      iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      this_02 = local_d0.nodeFactory;
      RVar3 = nullAST;
      if (iVar2 != 0x15) {
        if (nullAST.ref == (Ref *)0x0) {
          RVar3.ref = (Ref *)0x0;
        }
        else {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        local_d0._vptr_ASTFactory = (_func_int **)RVar3.ref;
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
        ASTFactory::create(&local_b0,(RefToken *)this_01);
        RefCount<AST>::operator=((RefCount<AST> *)&local_d0,(RefCount<AST> *)&local_b0);
        RefCount<AST>::~RefCount((RefCount<AST> *)&local_b0);
        RefCount<Token>::~RefCount(&local_80);
        Parser::match((Parser *)this,7);
        RefCount<AST>::operator=((RefCount<AST> *)&local_b0.nodeFactory,&local_98.root);
        RefCount<AST>::~RefCount((RefCount<AST> *)&local_d0);
        RefCount<AST>::~RefCount((RefCount<AST> *)local_c0);
        RefCount<AST>::~RefCount((RefCount<AST> *)(local_c0 + 8));
        RefCount<AST>::~RefCount(&local_a0);
        RefCount<AST>::operator=((RefCount<AST> *)this_02,(RefCount<AST> *)&local_b0.nodeFactory);
        RefCount<AST>::~RefCount((RefCount<AST> *)&local_b0.nodeFactory);
        RefCount<AST>::~RefCount(&local_98.child);
        RefCount<AST>::~RefCount(&local_98.root);
        return;
      }
    }
    iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    RVar3 = nullAST;
    if (iVar2 != 0x14) {
      if (iVar2 != 0x15) {
        this_03 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_58,this,1);
        NoViableAltException::NoViableAltException(this_03,&local_58);
        __cxa_throw(this_03,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      if (nullAST.ref == (Ref *)0x0) {
        RVar3.ref = (Ref *)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      local_d0._vptr_ASTFactory = (_func_int **)RVar3.ref;
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_50,this,1);
      ASTFactory::create(&local_b0,(RefToken *)this_01);
      RefCount<AST>::operator=((RefCount<AST> *)&local_d0,(RefCount<AST> *)&local_b0);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_b0);
      RefCount<Token>::~RefCount(&local_50);
      Parser::match((Parser *)this,0x15);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_d0);
    }
    local_d0._vptr_ASTFactory = (_func_int **)nullAST.ref;
    if (nullAST.ref == (Ref *)0x0) {
      local_d0._vptr_ASTFactory = (_func_int **)0x0;
    }
    else {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_38,this,1);
    ASTFactory::create(&local_b0,(RefToken *)this_01);
    RefCount<AST>::operator=((RefCount<AST> *)&local_d0,(RefCount<AST> *)&local_b0);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_b0);
    RefCount<Token>::~RefCount(&local_38);
    if ((Ref *)local_d0._vptr_ASTFactory == (Ref *)0x0) {
      local_78.ref = (Ref *)0x0;
    }
    else {
      *(uint *)((long)local_d0._vptr_ASTFactory + 8) =
           *(uint *)((long)local_d0._vptr_ASTFactory + 8) + 1;
      local_78.ref = (Ref *)local_d0._vptr_ASTFactory;
    }
    ASTFactory::addASTChild(this_01,&local_98,&local_78);
    RefCount<AST>::~RefCount(&local_78);
    Parser::match((Parser *)this,0x14);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_d0);
  } while( true );
}

Assistant:

void GrpParser::postscriptFunc() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST postscriptFunc_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp119_AST = nullAST;
		tmp119_AST = astFactory.create(LT(1));
		astFactory.makeASTRoot(currentAST, tmp119_AST);
		match(LITERAL_postscript);
		RefAST tmp120_AST = nullAST;
		tmp120_AST = astFactory.create(LT(1));
		match(OP_LPAREN);
		RefAST tmp121_AST = nullAST;
		tmp121_AST = astFactory.create(LT(1));
		astFactory.addASTChild(currentAST, tmp121_AST);
		match(LIT_STRING);
		{
		do {
			if ((LA(1)==LIT_STRING||LA(1)==OP_COMMA)) {
				{
				switch ( LA(1)) {
				case OP_COMMA:
				{
					RefAST tmp122_AST = nullAST;
					tmp122_AST = astFactory.create(LT(1));
					match(OP_COMMA);
					break;
				}
				case LIT_STRING:
				{
					break;
				}
				default:
				{
					throw NoViableAltException(LT(1));
				}
				}
				}
				RefAST tmp123_AST = nullAST;
				tmp123_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp123_AST);
				match(LIT_STRING);
			}
			else {
				goto _loop111;
			}
			
		} while (true);
		_loop111:;
		}
		RefAST tmp124_AST = nullAST;
		tmp124_AST = astFactory.create(LT(1));
		match(OP_RPAREN);
		postscriptFunc_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_35);
	}
	returnAST = postscriptFunc_AST;
}